

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O2

DdNode * Abc_NtkInitStateVarMap(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  DdNode **ppDVar1;
  DdNode **x;
  DdNode **y;
  Abc_Obj_t *pAVar2;
  DdNode *pDVar3;
  long lVar4;
  DdNode *n;
  size_t __size;
  
  __size = (long)dd->size << 3;
  x = (DdNode **)malloc(__size);
  y = (DdNode **)malloc(__size);
  n = dd->one;
  Cudd_Ref(n);
  for (lVar4 = 0; lVar4 < pNtk->vBoxes->nSize; lVar4 = lVar4 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,(int)lVar4);
    pDVar3 = n;
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      ppDVar1 = dd->vars;
      pDVar3 = ppDVar1[pNtk->vPis->nSize + lVar4];
      x[lVar4] = pDVar3;
      y[lVar4] = ppDVar1[pNtk->vCis->nSize + lVar4];
      pDVar3 = Cudd_bddAnd(dd,n,(DdNode *)
                                ((ulong)((pAVar2->field_5).pData != (void *)0x2) ^ (ulong)pDVar3));
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,n);
    }
    n = pDVar3;
  }
  Cudd_SetVarMap(dd,x,y,pNtk->nObjCounts[8]);
  free(x);
  free(y);
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Abc_NtkInitStateVarMap( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd, * bVar;
    Abc_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Abc_NtkPiNum(pNtk) + i ];
        pbVarsY[i] = dd->vars[ Abc_NtkCiNum(pNtk) + i ];
        // get the initial value of the latch
        bVar  = Cudd_NotCond( pbVarsX[i], !Abc_LatchIsInit1(pLatch) );
        bProd = Cudd_bddAnd( dd, bTemp = bProd, bVar );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Abc_NtkLatchNum(pNtk) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}